

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O1

void __thiscall
IfNeuron::calibrate(IfNeuron *this,int isi,int spikes,int maxtime,NoiseSource *noises,
                   double increment,double decrement)

{
  StochasticEventGenerator *event;
  double dVar1;
  ostream *poVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  double dVar8;
  IntervalEstimator estimator;
  NullStream devnull;
  double local_380;
  IntervalEstimator local_328;
  undefined1 local_240 [272];
  Matrix local_130;
  
  dVar1 = DifferentialEquation::getStartingValue(&this->ifneuronMembrane);
  this->ifneuronTheta = dVar1;
  event = &(this->super_SpikingNeuron).super_StochasticEventGenerator;
  IntervalEstimator::IntervalEstimator
            (&local_328,&EST_MEAN,event,
             (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
             super_StochasticProcess.super_TimeDependent.xTime);
  NullStream::NullStream((NullStream *)local_240);
  local_380 = 20.0;
  uVar4 = 1;
  iVar3 = 0;
  do {
    Time::run((this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.super_TimeDependent.xTime,(long)spikes,event,(long)maxtime,
              (ostream *)local_240,true);
    ScalarEstimator::getEstimate(&local_130,&local_328.super_ScalarEstimator,&EST_MEAN);
    dVar1 = Matrix::to_d(&local_130);
    dVar1 = dVar1 / ((this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_TimeDependent.xTime)->dt
    ;
    Matrix::~Matrix(&local_130);
    if (1e-05 <= local_380) {
      uVar7 = -(ulong)(dVar1 == 0.0);
      dVar1 = (double)(uVar7 & 0x44b52d02c7e14af6 | ~uVar7 & (ulong)dVar1);
      bVar6 = (double)isi <= dVar1;
      bVar5 = uVar4 != (-(uint)bVar6 | 1);
      dVar8 = decrement;
      if (bVar5) {
        dVar8 = increment;
      }
      if (!bVar5) {
        uVar4 = (bVar6 - 1) + (uint)bVar6;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\rthreshold: ",0xc);
      poVar2 = std::ostream::_M_insert<double>(this->ifneuronTheta);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", spike rate: ",0xe);
      poVar2 = std::ostream::_M_insert<double>
                         (1.0 / (dVar1 * ((this->super_SpikingNeuron).super_StochasticEventGenerator
                                          .super_StochasticVariable.super_StochasticProcess.
                                          super_TimeDependent.xTime)->dt));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," Hz, target rate: ",0x12);
      poVar2 = std::ostream::_M_insert<double>
                         (1.0 / (((this->super_SpikingNeuron).super_StochasticEventGenerator.
                                  super_StochasticVariable.super_StochasticProcess.
                                  super_TimeDependent.xTime)->dt * (double)isi));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," Hz, next correction: ",0x16);
      dVar8 = dVar8 * local_380;
      poVar2 = std::ostream::_M_insert<double>((double)(int)uVar4 * dVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\t\t",3);
      std::ostream::flush();
      this->ifneuronTheta = this->ifneuronTheta - (double)(int)uVar4 * dVar8;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\ncalibrated neuron after ",0x19);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," steps.\t\t\t\t\t",0xc);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      dVar8 = local_380;
    }
    if (local_380 < 1e-05) break;
    bVar6 = iVar3 != 999;
    iVar3 = iVar3 + 1;
    local_380 = dVar8;
  } while (bVar6);
  (*(event->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric[0xd]
  )();
  std::ios_base::~ios_base((ios_base *)(local_240 + 8));
  IntervalEstimator::~IntervalEstimator(&local_328);
  return;
}

Assistant:

void IfNeuron::calibrate(int isi, int spikes, int maxtime, NoiseSource *noises, double increment, double decrement)
{
	double stepsize = 20.0; // starting stepsize
	ifneuronTheta = ifneuronMembrane.getStartingValue();
	int direction = 1; // current direction 1-up, -1-down

	// new interval estimator, measuring time in units
	IntervalEstimator estimator(EST_MEAN, this, xTime);
	
	NullStream devnull;
	
	for( int k=0; k<1000; k++) {
		
		// test fpt
		xTime->run( spikes, this, maxtime, devnull );
		double mean = estimator.getEstimate(EST_MEAN).to_d() / xTime->dt;
		if( mean==0.0 ) mean = 1e23;
		
		// early stopping
		if( stepsize<0.00001 ) {
			cout << "\ncalibrated neuron after " << k << " steps.\t\t\t\t\t" << endl;
			break;
		}
	
		// adjust threshold
		if(mean < isi) {
			if (direction == 1) {
				// mean too large and direction up - decrease stepsize and turn
				stepsize *= decrement;
				direction *= -1;
			} else {
				// mean too large and direction down - increase stepsize and go on
				stepsize *= increment;
			}
		} else {
			if (direction == -1) {
				// mean too small and direction down - decrease stepsize and turn
				stepsize *= decrement;
				direction *= -1;
			} else {
				// mean too small and direction up - increase stepsize and go on
				stepsize *= increment;
			}
		}
		
		// note to the user
		cout << "\rthreshold: " << ifneuronTheta << ", spike rate: " << 1.0/(mean*xTime->dt) << " Hz, target rate: " << 1.0/(isi*xTime->dt) << " Hz, next correction: " << direction*stepsize << "\t\t\t" << flush;

		// apply correction
		ifneuronTheta -= direction * stepsize;
	}
	
	init();
}